

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::
parse_inline_table<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
          (result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc,size_t n_rec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __node_base *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  byte bVar4;
  const_iterator f;
  char *pcVar5;
  pointer n_rec_00;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  iter;
  byte *pbVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  bool bVar8;
  undefined8 uVar9;
  value_type *pvVar10;
  error_type *peVar11;
  internal_error *this_00;
  error_type *__rhs;
  syntax_error *psVar12;
  result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *prVar13;
  location *ctx;
  EVP_PKEY_CTX *ctx_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_04;
  result<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  inserted;
  result<toml::detail::region,_toml::detail::none_t> sp;
  result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  kv_r;
  table_type retval;
  uint in_stack_fffffffffffffb2c;
  undefined1 in_stack_fffffffffffffb30;
  allocator_type local_4c9;
  location *local_4c8;
  result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_4c0;
  string local_4b8;
  string local_498;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_470;
  undefined1 local_458 [56];
  region local_420;
  result<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d8;
  const_iterator local_3b0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_3a8;
  location *local_3a0;
  undefined1 local_398 [80];
  undefined1 local_348 [56];
  region local_310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  undefined8 *local_2b0;
  ulong *local_2a8;
  undefined1 local_2a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290 [4];
  undefined1 local_250 [56];
  region local_218;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1a0;
  result<toml::detail::region,_toml::detail::none_t> local_168;
  result<toml::detail::region,_toml::detail::none_t> local_118;
  result<toml::detail::region,_toml::detail::none_t> local_c8;
  undefined1 local_78 [72];
  
  local_4c8 = (location *)this;
  local_4c0 = __return_storage_ptr__;
  local_3a0 = loc;
  if ((location *)0x40 < loc) {
    psVar12 = (syntax_error *)__cxa_allocate_exception(0x78);
    local_458._0_8_ = local_458 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_458,"toml::parse_inline_table: recursion limit (64) exceeded","");
    source_location::source_location((source_location *)local_250,local_4c8);
    syntax_error::syntax_error(psVar12,(string *)local_458,(source_location *)local_250);
    __cxa_throw(psVar12,&syntax_error::typeinfo,syntax_error::~syntax_error);
  }
  f._M_current = *(char **)(this + 0x40);
  local_1a0._M_buckets = &local_1a0._M_single_bucket;
  local_1a0._M_bucket_count = 1;
  local_1a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1a0._M_element_count = 0;
  local_1a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_1a0._M_rehash_policy._M_next_resize = 0;
  local_1a0._M_single_bucket = (__node_base_ptr)0x0;
  if ((f._M_current == *(char **)(*(long *)(this + 8) + 8)) || (*f._M_current != '{')) {
    local_398._0_8_ = local_398 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_398,"toml::parse_inline_table: ","");
    source_location::source_location((source_location *)local_458,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[38],_true>
              ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_250,(source_location *)local_458,
               (char (*) [38])"the next token is not an inline table");
    __l._M_len = 1;
    __l._M_array = (iterator)local_250;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_3d8,__l,(allocator_type *)&local_4b8);
    local_498._M_dataplus._M_p = (pointer)0x0;
    local_498._M_string_length = 0;
    local_498.field_2._M_allocated_capacity = 0;
    format_underline((string *)local_2a0,(string *)local_398,
                     (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_3d8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_498,false);
    uVar9 = local_2a0._8_8_;
    local_348._0_8_ = local_348 + 0x10;
    if ((undefined1 *)local_2a0._0_8_ == local_2a0 + 0x10) {
      local_348._24_8_ = local_290[0]._8_8_;
      local_2a0._0_8_ = local_348._0_8_;
    }
    local_348._17_7_ = local_290[0]._M_allocated_capacity._1_7_;
    local_348[0x10] = local_290[0]._M_local_buf[0];
    local_2a0._8_8_ = (_func_int **)0x0;
    local_290[0]._M_local_buf[0] = '\0';
    local_4c0->is_ok_ = false;
    paVar1 = &(local_4c0->field_1).fail.value.field_2;
    (local_4c0->field_1).succ.value.first._M_h._M_buckets = (__buckets_ptr)paVar1;
    if (local_2a0._0_8_ == local_348._0_8_) {
      paVar1->_M_allocated_capacity = local_348._16_8_;
      (local_4c0->field_1).succ.value.first._M_h._M_element_count = local_348._24_8_;
    }
    else {
      (local_4c0->field_1).succ.value.first._M_h._M_buckets = (__buckets_ptr)local_2a0._0_8_;
      (local_4c0->field_1).fail.value.field_2._M_allocated_capacity = local_348._16_8_;
    }
    (local_4c0->field_1).succ.value.first._M_h._M_bucket_count = uVar9;
    local_348._8_8_ = (element_type *)0x0;
    local_348._16_8_ = (ulong)(uint7)local_290[0]._1_7_ << 8;
    local_2a0._0_8_ = local_2a0 + 0x10;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_498);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218.source_name_._M_dataplus._M_p != &local_218.source_name_.field_2) {
      operator_delete(local_218.source_name_._M_dataplus._M_p,
                      local_218.source_name_.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)local_250);
    source_location::~source_location((source_location *)local_458);
    prVar13 = local_4c0;
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
      prVar13 = local_4c0;
    }
  }
  else {
    *(char **)(this + 0x40) = f._M_current + 1;
    maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>
    ::invoke(&local_c8,(location *)this);
    if (local_c8.is_ok_ == true) {
      region::~region(&local_c8.field_1.succ.value);
    }
    pcVar5 = *(char **)(this + 0x40);
    if ((pcVar5 == *(char **)(*(long *)(this + 8) + 8)) || (*pcVar5 != '}')) {
      local_3a0 = (location *)((long)&(local_3a0->super_region_base)._vptr_region_base + 1);
      paVar1 = &local_420.source_name_.field_2;
      local_3a8 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_4c0->field_1;
      local_2a8 = (ulong *)((long)&local_4c0->field_1 + 0x60);
      local_2b0 = (undefined8 *)((long)&local_4c0->field_1 + 0x70);
      local_3b0._M_current = f._M_current;
      do {
        n_rec_00 = (((location *)this)->iter_)._M_current;
        if (n_rec_00 ==
            (((((location *)this)->source_).
              super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          location::reset((location *)this,local_3b0);
          psVar12 = (syntax_error *)__cxa_allocate_exception(0x78);
          local_398._0_8_ = local_398 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_398,
                     "toml::parse_inline_table: inline table did not closed by `}`","");
          source_location::source_location((source_location *)local_458,local_4c8);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<toml::source_location,_const_char_(&)[17],_true>
                    ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_250,(source_location *)local_458,(char (*) [17])"should be closed");
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)local_250;
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_3d8,__l_01,(allocator_type *)&local_4b8);
          local_498._M_dataplus._M_p = (pointer)0x0;
          local_498._M_string_length = 0;
          local_498.field_2._M_allocated_capacity = 0;
          format_underline((string *)local_2a0,(string *)local_398,
                           (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_3d8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_498,false);
          source_location::source_location((source_location *)local_348,local_4c8);
          syntax_error::syntax_error(psVar12,(string *)local_2a0,(source_location *)local_348);
          __cxa_throw(psVar12,&syntax_error::typeinfo,syntax_error::~syntax_error);
        }
        parse_key_value_pair<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
                  ((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_250,this,local_3a0,(size_t)n_rec_00);
        if (local_250[0] == false) {
          peVar11 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::unwrap_err((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_250);
          ctx_00 = (EVP_PKEY_CTX *)(peVar11->_M_dataplus)._M_p;
          local_458._0_8_ = local_458 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_458,ctx_00,ctx_00 + peVar11->_M_string_length);
          prVar13 = local_4c0;
          local_4c0->is_ok_ = false;
          p_Var2 = &(local_4c0->field_1).succ.value.first._M_h._M_before_begin;
          (local_4c0->field_1).succ.value.first._M_h._M_buckets = &p_Var2->_M_nxt;
          if ((undefined1 *)local_458._0_8_ == local_458 + 0x10) {
            p_Var2->_M_nxt = (_Hash_node_base *)local_458._16_8_;
            (local_4c0->field_1).succ.value.first._M_h._M_element_count = local_458._24_8_;
          }
          else {
            (((value_type *)&local_3a8->_M_buckets)->first)._M_h._M_buckets =
                 (__buckets_ptr)local_458._0_8_;
            p_Var2->_M_nxt = (_Hash_node_base *)local_458._16_8_;
          }
          (local_4c0->field_1).succ.value.first._M_h._M_bucket_count = local_458._8_8_;
          result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::cleanup((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_250,ctx_00);
          break;
        }
        pvVar10 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::unwrap((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_250);
        v = (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
            (pvVar10->first).first.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
        iter._M_current =
             (pvVar10->first).first.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        region::region((region *)local_78,&(pvVar10->first).second);
        insert_nested_key<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (&local_3d8,(detail *)&local_1a0,(table_type *)&pvVar10->second,v,iter,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   (region *)((ulong)in_stack_fffffffffffffb2c << 0x20),
                   (bool)in_stack_fffffffffffffb30);
        region::~region((region *)local_78);
        this = (detail *)local_4c8;
        if (local_3d8.is_ok_ == false) {
          this_00 = (internal_error *)__cxa_allocate_exception(0x78);
          __rhs = result<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::unwrap_err(&local_3d8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_348,"toml::parse_inline_table: failed to insert value into table: ",
                         __rhs);
          source_location::source_location((source_location *)local_458,local_4c8);
          internal_error::internal_error(this_00,(string *)local_348,(source_location *)local_458);
          __cxa_throw(this_00,&internal_error::typeinfo,internal_error::~internal_error);
        }
        sequence<toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>,_toml::detail::character<','>_>
        ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_2a0,local_4c8);
        bVar8 = local_2a0[0];
        if (local_2a0[0] == false) {
          maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>
          ::invoke(&local_118,(location *)this);
          if (local_118.is_ok_ == true) {
            region::~region(&local_118.field_1.succ.value);
          }
          pbVar6 = (byte *)(((location *)this)->iter_)._M_current;
          if (pbVar6 == (byte *)(((((location *)this)->source_).
                                  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                super__Vector_impl_data._M_finish) {
            psVar12 = (syntax_error *)__cxa_allocate_exception(0x78);
            local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_4b8,"toml::parse_inline_table: missing table separator `}` "
                       ,"");
            source_location::source_location((source_location *)local_348,local_4c8);
            std::
            pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<toml::source_location,_const_char_(&)[14],_true>
                      ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_458,(source_location *)local_348,(char (*) [14])"should be `}`");
            __l_02._M_len = 1;
            __l_02._M_array = (iterator)local_458;
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector(&local_470,__l_02,&local_4c9);
            local_2c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            format_underline(&local_498,&local_4b8,&local_470,&local_2c8,false);
            source_location::source_location((source_location *)local_398,local_4c8);
            syntax_error::syntax_error(psVar12,&local_498,(source_location *)local_398);
            __cxa_throw(psVar12,&syntax_error::typeinfo,syntax_error::~syntax_error);
          }
          bVar4 = *pbVar6;
          if (bVar4 != 0x7d) {
            if ((bVar4 < 0x24) && ((0x800002400U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
              psVar12 = (syntax_error *)__cxa_allocate_exception(0x78);
              local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4b8,"toml::parse_inline_table: missing curly brace `}`",""
                        );
              source_location::source_location((source_location *)local_348,local_4c8);
              std::
              pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<toml::source_location,_const_char_(&)[14],_true>
                        ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_458,(source_location *)local_348,(char (*) [14])"should be `}`");
              __l_00._M_len = 1;
              __l_00._M_array = (iterator)local_458;
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector(&local_470,__l_00,&local_4c9);
              local_2c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_2c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              format_underline(&local_498,&local_4b8,&local_470,&local_2c8,false);
              source_location::source_location((source_location *)local_398,local_4c8);
              syntax_error::syntax_error(psVar12,&local_498,(source_location *)local_398);
              __cxa_throw(psVar12,&syntax_error::typeinfo,syntax_error::~syntax_error);
            }
            psVar12 = (syntax_error *)__cxa_allocate_exception(0x78);
            local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_4b8,"toml::parse_inline_table: missing table separator `,` "
                       ,"");
            source_location::source_location((source_location *)local_348,local_4c8);
            std::
            pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<toml::source_location,_const_char_(&)[14],_true>
                      ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_458,(source_location *)local_348,(char (*) [14])"should be `,`");
            __l_03._M_len = 1;
            __l_03._M_array = (iterator)local_458;
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector(&local_470,__l_03,&local_4c9);
            local_2c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            format_underline(&local_498,&local_4b8,&local_470,&local_2c8,false);
            source_location::source_location((source_location *)local_398,local_4c8);
            syntax_error::syntax_error(psVar12,&local_498,(source_location *)local_398);
            __cxa_throw(psVar12,&syntax_error::typeinfo,syntax_error::~syntax_error);
          }
          (((location *)this)->iter_)._M_current = (char *)(pbVar6 + 1);
          region::region((region *)local_398,(location *)this,(const_iterator)local_3b0._M_current,
                         (const_iterator)(pbVar6 + 1));
          std::
          pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>
          ::
          pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_&,_toml::detail::region,_true>
                    ((pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>
                      *)local_348,
                     (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                      *)&local_1a0,(region *)local_398);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)local_458,
                       (pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>
                        *)local_348,
                       (pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>
                        *)local_348);
          prVar13 = local_4c0;
          local_420.super_region_base._vptr_region_base = (_func_int **)&PTR__region_001c5698;
          local_420.source_.
          super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_310.source_.
                    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          local_420.source_.
          super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi =
               local_310.source_.
               super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          local_310.source_.
          super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_310.source_.
          super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          paVar3 = &local_310.source_name_.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310.source_name_._M_dataplus._M_p == paVar3) {
            local_420.source_name_.field_2._8_8_ = local_310.source_name_.field_2._8_8_;
            local_420.source_name_._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_420.source_name_._M_dataplus._M_p = local_310.source_name_._M_dataplus._M_p;
          }
          local_420.source_name_.field_2._M_allocated_capacity._1_7_ =
               local_310.source_name_.field_2._M_allocated_capacity._1_7_;
          local_420.source_name_.field_2._M_local_buf[0] =
               local_310.source_name_.field_2._M_local_buf[0];
          local_420.source_name_._M_string_length = local_310.source_name_._M_string_length;
          local_310.source_name_._M_string_length = 0;
          local_310.source_name_.field_2._M_local_buf[0] = '\0';
          local_420.first_._M_current._0_4_ = local_310.first_._M_current._0_4_;
          local_420.first_._M_current._4_4_ = local_310.first_._M_current._4_4_;
          local_420.last_._M_current._0_4_ = local_310.last_._M_current._0_4_;
          local_420.last_._M_current._4_4_ = local_310.last_._M_current._4_4_;
          local_4c0->is_ok_ = true;
          ctx = (location *)local_458;
          local_310.source_name_._M_dataplus._M_p = (pointer)paVar3;
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_Hashtable(local_3a8);
          _Var7._M_pi = local_420.source_.
                        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          (prVar13->field_1).succ.value.second.super_region_base._vptr_region_base =
               (_func_int **)&PTR__region_001c5698;
          local_420.source_.
          super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (prVar13->field_1).succ.value.second.source_.
          super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_420.source_.
                    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (prVar13->field_1).succ.value.second.source_.
          super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = _Var7._M_pi;
          local_420.source_.
          super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (prVar13->field_1).succ.value.second.source_name_._M_dataplus._M_p = (pointer)local_2a8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420.source_name_._M_dataplus._M_p == paVar1) {
            *local_2a8 = local_420.source_name_.field_2._M_allocated_capacity;
            local_2a8[1] = local_420.source_name_.field_2._8_8_;
          }
          else {
            (prVar13->field_1).succ.value.second.source_name_._M_dataplus._M_p =
                 local_420.source_name_._M_dataplus._M_p;
            (prVar13->field_1).succ.value.second.source_name_.field_2._M_allocated_capacity =
                 local_420.source_name_.field_2._M_allocated_capacity;
          }
          (prVar13->field_1).succ.value.second.source_name_._M_string_length =
               local_420.source_name_._M_string_length;
          local_420.source_name_._M_string_length = 0;
          local_420.source_name_.field_2._M_allocated_capacity =
               local_420.source_name_.field_2._M_allocated_capacity & 0xffffffffffffff00;
          *local_2b0 = CONCAT44(local_420.first_._M_current._4_4_,local_420.first_._M_current._0_4_)
          ;
          local_2b0[1] = CONCAT44(local_420.last_._M_current._4_4_,local_420.last_._M_current._0_4_)
          ;
          local_420.source_name_._M_dataplus._M_p = (pointer)paVar1;
          region::~region(&local_420);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_458);
          region::~region(&local_310);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_348);
          region::~region((region *)local_398);
        }
        else {
          ctx = (location *)this;
          maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>
          ::invoke(&local_168,(location *)this);
          if (local_168.is_ok_ == true) {
            region::~region(&local_168.field_1.succ.value);
          }
          pcVar5 = (((location *)this)->iter_)._M_current;
          if ((pcVar5 != (((((location *)this)->source_).
                           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_finish) && (*pcVar5 == '}')) {
            psVar12 = (syntax_error *)__cxa_allocate_exception(0x78);
            local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_4b8,
                       "toml::parse_inline_table: trailing comma is not allowed in an inline table",
                       "");
            source_location::source_location((source_location *)local_348,local_4c8);
            std::
            pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<toml::source_location,_const_char_(&)[14],_true>
                      ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_458,(source_location *)local_348,(char (*) [14])"should be `}`");
            __l_04._M_len = 1;
            __l_04._M_array = (iterator)local_458;
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector(&local_470,__l_04,&local_4c9);
            local_2c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            format_underline(&local_498,&local_4b8,&local_470,&local_2c8,false);
            source_location::source_location((source_location *)local_398,local_4c8);
            syntax_error::syntax_error(psVar12,&local_498,(source_location *)local_398);
            __cxa_throw(psVar12,&syntax_error::typeinfo,syntax_error::~syntax_error);
          }
        }
        if (local_2a0[0] == true) {
          region::~region((region *)(local_2a0 + 8));
        }
        if ((local_3d8.is_ok_ == false) &&
           (local_3d8.field_1.fail.value._M_dataplus._M_p !=
            (pointer)((long)&local_3d8.field_1 + 0x10))) {
          ctx = (location *)(local_3d8.field_1._16_8_ + 1);
          operator_delete((void *)local_3d8.field_1.fail.value._M_dataplus._M_p,(ulong)ctx);
        }
        result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::cleanup((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_250,(EVP_PKEY_CTX *)ctx);
        prVar13 = local_4c0;
      } while (bVar8 != false);
    }
    else {
      *(char **)(this + 0x40) = pcVar5 + 1;
      region::region((region *)local_348,(location *)this,f,(const_iterator)(pcVar5 + 1));
      std::
      pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>
      ::
      pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_&,_toml::detail::region,_true>
                ((pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>
                  *)local_458,
                 (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                  *)&local_1a0,(region *)local_348);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_250,local_458,local_458);
      prVar13 = local_4c0;
      local_218.super_region_base._vptr_region_base = (_func_int **)&PTR__region_001c5698;
      local_218.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_420.source_.
                super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_218.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           local_420.source_.
           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      local_420.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_420.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      paVar1 = &local_218.source_name_.field_2;
      paVar3 = &local_420.source_name_.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420.source_name_._M_dataplus._M_p == paVar3) {
        local_218.source_name_.field_2._8_8_ = local_420.source_name_.field_2._8_8_;
        local_218.source_name_._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_218.source_name_._M_dataplus._M_p = local_420.source_name_._M_dataplus._M_p;
      }
      local_218.source_name_.field_2._M_allocated_capacity =
           local_420.source_name_.field_2._M_allocated_capacity;
      local_218.source_name_._M_string_length = local_420.source_name_._M_string_length;
      local_420.source_name_._M_string_length = 0;
      local_420.source_name_.field_2._M_allocated_capacity =
           local_420.source_name_.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_218.first_._M_current._0_4_ = local_420.first_._M_current._0_4_;
      local_218.first_._M_current._4_4_ = local_420.first_._M_current._4_4_;
      local_218.last_._M_current._0_4_ = local_420.last_._M_current._0_4_;
      local_218.last_._M_current._4_4_ = local_420.last_._M_current._4_4_;
      local_4c0->is_ok_ = true;
      local_420.source_name_._M_dataplus._M_p = (pointer)paVar3;
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&local_4c0->field_1,local_250,local_250);
      _Var7._M_pi = local_218.source_.
                    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      (prVar13->field_1).succ.value.second.super_region_base._vptr_region_base =
           (_func_int **)&PTR__region_001c5698;
      local_218.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (prVar13->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_218.source_.
                super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (prVar13->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = _Var7._M_pi;
      local_218.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      paVar3 = &(prVar13->field_1).succ.value.second.source_name_.field_2;
      (prVar13->field_1).succ.value.second.source_name_._M_dataplus._M_p = (pointer)paVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218.source_name_._M_dataplus._M_p == paVar1) {
        paVar3->_M_allocated_capacity = local_218.source_name_.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&(prVar13->field_1).succ.value.second.source_name_.field_2 + 8) =
             local_218.source_name_.field_2._8_8_;
      }
      else {
        (prVar13->field_1).succ.value.second.source_name_._M_dataplus._M_p =
             local_218.source_name_._M_dataplus._M_p;
        (prVar13->field_1).succ.value.second.source_name_.field_2._M_allocated_capacity =
             local_218.source_name_.field_2._M_allocated_capacity;
      }
      (prVar13->field_1).succ.value.second.source_name_._M_string_length =
           local_218.source_name_._M_string_length;
      local_218.source_name_._M_string_length = 0;
      local_218.source_name_.field_2._M_allocated_capacity =
           local_218.source_name_.field_2._M_allocated_capacity & 0xffffffffffffff00;
      (prVar13->field_1).succ.value.second.first_._M_current =
           (char *)CONCAT44(local_218.first_._M_current._4_4_,local_218.first_._M_current._0_4_);
      (prVar13->field_1).succ.value.second.last_._M_current =
           (char *)CONCAT44(local_218.last_._M_current._4_4_,local_218.last_._M_current._0_4_);
      local_218.source_name_._M_dataplus._M_p = (pointer)paVar1;
      region::~region(&local_218);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_250);
      region::~region(&local_420);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_458);
      region::~region((region *)local_348);
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1a0);
  return prVar13;
}

Assistant:

result<std::pair<typename Value::table_type, region>, std::string>
parse_inline_table(location& loc, const std::size_t n_rec)
{
    using value_type = Value;
    using table_type = typename value_type::table_type;

    if(n_rec > TOML11_VALUE_RECURSION_LIMIT)
    {
        throw syntax_error(std::string("toml::parse_inline_table: recursion limit ("
                TOML11_STRINGIZE(TOML11_VALUE_RECURSION_LIMIT) ") exceeded"),
                source_location(loc));
    }

    const auto first = loc.iter();
    table_type retval;
    if(!(loc.iter() != loc.end() && *loc.iter() == '{'))
    {
        return err(format_underline("toml::parse_inline_table: ",
            {{source_location(loc), "the next token is not an inline table"}}));
    }
    loc.advance();

    // check if the inline table is an empty table = { }
    maybe<lex_ws>::invoke(loc);
    if(loc.iter() != loc.end() && *loc.iter() == '}')
    {
        loc.advance(); // skip `}`
        return ok(std::make_pair(retval, region(loc, first, loc.iter())));
    }

    // it starts from "{". it should be formatted as inline-table
    while(loc.iter() != loc.end())
    {
        const auto kv_r = parse_key_value_pair<value_type>(loc, n_rec+1);
        if(!kv_r)
        {
            return err(kv_r.unwrap_err());
        }

        const auto&              kvpair  = kv_r.unwrap();
        const std::vector<key>&  keys    = kvpair.first.first;
        const auto&              key_reg = kvpair.first.second;
        const value_type&        val     = kvpair.second;

        const auto inserted =
            insert_nested_key(retval, val, keys.begin(), keys.end(), key_reg);
        if(!inserted)
        {
            throw internal_error("toml::parse_inline_table: "
                "failed to insert value into table: " + inserted.unwrap_err(),
                source_location(loc));
        }

        using lex_table_separator = sequence<maybe<lex_ws>, character<','>>;
        const auto sp = lex_table_separator::invoke(loc);

        if(!sp)
        {
            maybe<lex_ws>::invoke(loc);

            if(loc.iter() == loc.end())
            {
                throw syntax_error(format_underline(
                    "toml::parse_inline_table: missing table separator `}` ",
                    {{source_location(loc), "should be `}`"}}),
                    source_location(loc));
            }
            else if(*loc.iter() == '}')
            {
                loc.advance(); // skip `}`
                return ok(std::make_pair(
                            retval, region(loc, first, loc.iter())));
            }
            else if(*loc.iter() == '#' || *loc.iter() == '\r' || *loc.iter() == '\n')
            {
                throw syntax_error(format_underline(
                    "toml::parse_inline_table: missing curly brace `}`",
                    {{source_location(loc), "should be `}`"}}),
                    source_location(loc));
            }
            else
            {
                throw syntax_error(format_underline(
                    "toml::parse_inline_table: missing table separator `,` ",
                    {{source_location(loc), "should be `,`"}}),
                    source_location(loc));
            }
        }
        else // `,` is found
        {
            maybe<lex_ws>::invoke(loc);
            if(loc.iter() != loc.end() && *loc.iter() == '}')
            {
                throw syntax_error(format_underline(
                    "toml::parse_inline_table: trailing comma is not allowed in"
                    " an inline table",
                    {{source_location(loc), "should be `}`"}}),
                    source_location(loc));
            }
        }
    }
    loc.reset(first);
    throw syntax_error(format_underline("toml::parse_inline_table: "
            "inline table did not closed by `}`",
            {{source_location(loc), "should be closed"}}),
            source_location(loc));
}